

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExceptions_cpp.h
# Opt level: O2

void __thiscall moira::Moira::execInterrupt<(moira::Core)1>(Moira *this,u8 level)

{
  u32 *puVar1;
  u16 uVar2;
  u16 uVar3;
  
  if (level < 8) {
    (*this->_vptr_Moira[0x10])(this,(ulong)level);
    uVar2 = getSR(this);
    *(byte *)&this->flags = (byte)this->flags & 0xf9;
    (this->reg).ipl = '\0';
    (this->reg).sr.ipl = level;
    setSupervisorMode(this,true);
    (this->reg).sr.t1 = false;
    (this->reg).sr.t0 = false;
    *(byte *)&this->flags = (byte)this->flags & 0xcf;
    puVar1 = (this->reg).field_3.field_0.a + 7;
    *puVar1 = *puVar1 - 8;
    uVar3 = getIrqVector(this,level);
    (this->queue).ird = uVar3;
    write<(moira::Core)1,(moira::AddrSpace)1,2,0ull>
              (this,(this->reg).field_3.field_0.a[7] + 4,(uint)(ushort)(this->reg).pc);
    write<(moira::Core)1,(moira::AddrSpace)1,2,0ull>
              (this,(this->reg).field_3.field_0.a[7],(uint)uVar2);
    write<(moira::Core)1,(moira::AddrSpace)1,2,0ull>
              (this,(this->reg).field_3.field_0.a[7] + 2,
               (uint)*(ushort *)((long)&(this->reg).pc + 2));
    write<(moira::Core)1,(moira::AddrSpace)1,2,0ull>
              (this,(this->reg).field_3.field_0.a[7] + 6,(uint)(this->queue).ird << 2);
    jumpToVector<(moira::Core)1,1024ull>(this,(uint)(this->queue).ird);
    return;
  }
  __assert_fail("level < 8",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraExceptions_cpp.h"
                ,0x1f9,"void moira::Moira::execInterrupt(u8) [C = moira::Core::C68010]");
}

Assistant:

void
Moira::execInterrupt(u8 level)
{
    assert(level < 8);

    // Notify delegate
    willInterrupt(level);

    // Remember the current value of the status register
    u16 status = getSR();

    // Recover from stop state and terminate loop mode
    flags &= ~(State::STOPPED | State::LOOPING);

    // Clear the polled IPL value
    reg.ipl = 0;

    // Temporarily raise the interrupt threshold
    reg.sr.ipl = level;

    // Enter supervisor mode
    setSupervisorMode(true);

    // Disable tracing
    clearTraceFlags();
    flags &= ~State::TRACE_EXC;

    switch (C) {

        case Core::C68000:

            SYNC(6);
            reg.sp -= 6;
            write<C, AddrSpace::DATA, Word>(reg.sp + 4, reg.pc & 0xFFFF);

            SYNC(4);
            queue.ird = getIrqVector(level);

            SYNC(4);
            write<C, AddrSpace::DATA, Word>(reg.sp + 0, status);
            write<C, AddrSpace::DATA, Word>(reg.sp + 2, reg.pc >> 16);
            break;

        case Core::C68010:

            SYNC(12);
            reg.sp -= 8;
            queue.ird = getIrqVector(level);
            write<C, AddrSpace::DATA, Word>(reg.sp + 4, reg.pc & 0xFFFF);
            write<C, AddrSpace::DATA, Word>(reg.sp + 0, status);
            write<C, AddrSpace::DATA, Word>(reg.sp + 2, reg.pc >> 16);
            write<C, AddrSpace::DATA, Word>(reg.sp + 6, 4 * queue.ird);
            break;

        case Core::C68020:

            queue.ird = getIrqVector(level);

            writeStackFrame0000<C>(status, reg.pc, 4 * queue.ird);

            if (reg.sr.m) {

                writeStackFrame0001<C>(status, reg.pc, 4 * queue.ird);
            }
    }

    jumpToVector<C, AE_SET_CB3>(queue.ird);
}